

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceD.cpp
# Opt level: O1

istream * operator>>(istream *in,SequenceD<64> *t_seq)

{
  Sequence local_78;
  
  read_seq_from_chars(&local_78,in,4);
  std::deque<int,_std::allocator<int>_>::_M_move_assign1
            (&(t_seq->super_Sequence).m_bits,&local_78.m_bits);
  local_78._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_78.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  read_seq_from_chars(&local_78,in,4);
  std::deque<int,_std::allocator<int>_>::_M_move_assign1(&(t_seq->m_other).m_bits,&local_78.m_bits);
  local_78._vptr_Sequence = (_func_int **)&PTR_shift_00116d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_78.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  return in;
}

Assistant:

std::istream &operator>>(std::istream &in, SequenceD<64> &t_seq) {
    t_seq.left() = read_seq_from_chars(in, 4);
    t_seq.right() = read_seq_from_chars(in, 4);
    return in;
}